

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::Array<kj::_::ExceptionOr<kj::_::Void>_>::~Array(Array<kj::_::ExceptionOr<kj::_::Void>_> *this)

{
  ExceptionOr<kj::_::Void> *pEVar1;
  size_t sVar2;
  
  pEVar1 = this->ptr;
  if (pEVar1 != (ExceptionOr<kj::_::Void> *)0x0) {
    sVar2 = this->size_;
    this->ptr = (ExceptionOr<kj::_::Void> *)0x0;
    this->size_ = 0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pEVar1,0x1a0,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::_::ExceptionOr<kj::_::Void>_>::destruct);
  }
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }